

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConn.cpp
# Opt level: O1

string * __thiscall HttpConn::findInBody(string *__return_storage_ptr__,HttpConn *this,string *key)

{
  long lVar1;
  string *psVar2;
  
  psVar2 = &this->requestBody_;
  lVar1 = std::__cxx11::string::find((char *)psVar2,(ulong)(key->_M_dataplus)._M_p,0);
  if (lVar1 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::string::find((char)psVar2,0x26);
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)psVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HttpConn::findInBody(const std::string& key) {
    size_t idx = requestBody_.find(key);
    if (idx == requestBody_.npos) return "";
    idx += key.size() + 1;
    size_t s_idx = idx;
    idx = requestBody_.find('&', idx);
    if (idx == requestBody_.npos) return requestBody_.substr(s_idx);
    return requestBody_.substr(s_idx, idx - s_idx);
}